

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_7.cpp
# Opt level: O2

Roman_int * get_numeral(Roman_int *__return_storage_ptr__,istream *is)

{
  char cVar1;
  bool bVar2;
  istream *piVar3;
  char ch;
  ostringstream ss;
  char local_1c1;
  string local_1c0;
  ostringstream local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  do {
    piVar3 = std::operator>>(is,&local_1c1);
    cVar1 = local_1c1;
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
LAB_0010406b:
      std::__cxx11::stringbuf::str();
      Roman_int::Roman_int(__return_storage_ptr__,&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::ostringstream::~ostringstream(local_1a0);
      return __return_storage_ptr__;
    }
    bVar2 = is_numeral(local_1c1);
    if (!bVar2) {
      std::istream::unget();
      goto LAB_0010406b;
    }
    std::operator<<((ostream *)local_1a0,cVar1);
  } while( true );
}

Assistant:

Roman_int get_numeral(std::istream& is)
{
	std::ostringstream ss;
	char ch;
	while (is >> ch)
	{
		if (!is_numeral(ch))
		{
			is.unget();
			break;
		}
		ss << ch;
	}
	return Roman_int{ ss.str() };
}